

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qwidget.cpp
# Opt level: O1

void __thiscall QWidgetPrivate::show_recursive(QWidgetPrivate *this)

{
  QWidget *this_00;
  long lVar1;
  QLayout *this_01;
  
  this_00 = *(QWidget **)&this->field_0x8;
  if ((*(byte *)(*(long *)&this_00->field_0x8 + 0x243) & 0x10) == 0) {
    createRecursively(this);
  }
  QWidget::ensurePolished(this_00);
  if (((this_00->data->window_flags).super_QFlagsStorageHelper<Qt::WindowType,_4>.
       super_QFlagsStorage<Qt::WindowType>.i & 1) == 0) {
    lVar1 = *(long *)(*(long *)&this_00->field_0x8 + 0x10);
    this_01 = *(QLayout **)(*(long *)(lVar1 + 8) + 0x98);
    if ((this_01 != (QLayout *)0x0) && ((*(byte *)(*(long *)(lVar1 + 0x20) + 0x11) & 4) == 0)) {
      QLayout::activate(this_01);
    }
  }
  if (this->layout != (QLayout *)0x0) {
    QLayout::activate(this->layout);
  }
  show_helper(this);
  return;
}

Assistant:

void QWidgetPrivate::show_recursive()
{
    Q_Q(QWidget);
    // polish if necessary

    if (!q->testAttribute(Qt::WA_WState_Created))
        createRecursively();
    q->ensurePolished();

    if (!q->isWindow() && q->parentWidget()->d_func()->layout && !q->parentWidget()->data->in_show)
        q->parentWidget()->d_func()->layout->activate();
    // activate our layout before we and our children become visible
    if (layout)
        layout->activate();

    show_helper();
}